

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void aggregateConvertIndexedExprRefToColumn(AggInfo *pAggInfo)

{
  Expr *pExpr;
  int iVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  Walker local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.pParse = (Parse *)0x0;
  local_58.walkerDepth = 0;
  local_58.eCode = 0;
  local_58.mWFlags = 0;
  local_58.u.pNC = (NameContext *)0x0;
  local_58.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  local_58.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_58.xExprCallback = aggregateIdxEprRefToColCallback;
  iVar1 = pAggInfo->nFunc;
  if (0 < iVar1) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      pExpr = *(Expr **)((long)&pAggInfo->aFunc->pFExpr + lVar3);
      if (pExpr != (Expr *)0x0) {
        sqlite3WalkExprNN(&local_58,pExpr);
        iVar1 = pAggInfo->nFunc;
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar2 < iVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void aggregateConvertIndexedExprRefToColumn(AggInfo *pAggInfo){
  int i;
  Walker w;
  memset(&w, 0, sizeof(w));
  w.xExprCallback = aggregateIdxEprRefToColCallback;
  for(i=0; i<pAggInfo->nFunc; i++){
    sqlite3WalkExpr(&w, pAggInfo->aFunc[i].pFExpr);
  }
}